

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uchar * stbiw__zlib_flushf(uchar *data,uint *bitbuffer,int *bitcount)

{
  uint uVar1;
  uint uVar2;
  int *bitcount_local;
  uint *bitbuffer_local;
  uchar *data_local;
  
  bitbuffer_local = (uint *)data;
  while (7 < *bitcount) {
    if ((bitbuffer_local == (uint *)0x0) ||
       ((int)bitbuffer_local[-2] <= (int)(bitbuffer_local[-1] + 1))) {
      stbiw__sbgrowf(&bitbuffer_local,1,1);
    }
    uVar1 = *bitbuffer;
    uVar2 = bitbuffer_local[-1];
    bitbuffer_local[-1] = uVar2 + 1;
    *(char *)((long)bitbuffer_local + (long)(int)uVar2) = (char)uVar1;
    *bitbuffer = *bitbuffer >> 8;
    *bitcount = *bitcount + -8;
  }
  return (uchar *)bitbuffer_local;
}

Assistant:

static unsigned char *stbiw__zlib_flushf(unsigned char *data, unsigned int *bitbuffer, int *bitcount)
{
   while (*bitcount >= 8) {
      stbiw__sbpush(data, (unsigned char) *bitbuffer);
      *bitbuffer >>= 8;
      *bitcount -= 8;
   }
   return data;
}